

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BaseCase::verifyMessageString
          (BaseCase *this,MessageData *message)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  allocator<char> local_1a1;
  undefined1 local_1a0 [384];
  
  pTVar2 = ((this->super_ErrorCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1a0 + 8);
  local_1a0._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Driver says: \"");
  std::operator<<((ostream *)poVar1,(string *)&message->message);
  std::operator<<((ostream *)poVar1,"\"");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  if ((message->message)._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a0,"Empty message",&local_1a1);
    tcu::ResultCollector::addResult
              (&this->m_results,QP_TEST_RESULT_QUALITY_WARNING,(string *)local_1a0);
    std::__cxx11::string::~string((string *)local_1a0);
    poVar1 = (ostringstream *)(local_1a0 + 8);
    local_1a0._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Message message was empty");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  return;
}

Assistant:

void BaseCase::verifyMessageString (const MessageData& message)
{
	TestLog& log = m_testCtx.getLog();

	log << TestLog::Message << "Driver says: \"" << message.message << "\"" << TestLog::EndMessage;

	if (message.message.empty())
	{
		m_results.addResult(QP_TEST_RESULT_QUALITY_WARNING, "Empty message");
		log << TestLog::Message << "Message message was empty" << TestLog::EndMessage;
	}
}